

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int get_projected_gfu_boost
              (PRIMARY_RATE_CONTROL *p_rc,int gfu_boost,int frames_to_project,
              int num_stats_used_for_gfu_boost)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar1;
  double dVar2;
  int projected_gfu_boost;
  double tpl_factor_num_stats;
  double tpl_factor;
  double min_boost_factor;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  local_4 = in_ESI;
  if (in_ECX < in_EDX) {
    dVar1 = sqrt((double)*(int *)(in_RDI + 0x2130));
    dVar2 = av1_get_gfu_boost_projection_factor
                      ((double)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),dVar1,
                       (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    dVar1 = av1_get_gfu_boost_projection_factor
                      ((double)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),dVar1,
                       (int)((ulong)dVar2 >> 0x20));
    dVar1 = rint((dVar2 * (double)in_ESI) / dVar1);
    local_4 = (int)dVar1;
  }
  return local_4;
}

Assistant:

static int get_projected_gfu_boost(const PRIMARY_RATE_CONTROL *p_rc,
                                   int gfu_boost, int frames_to_project,
                                   int num_stats_used_for_gfu_boost) {
  /*
   * If frames_to_project is equal to num_stats_used_for_gfu_boost,
   * it means that gfu_boost was calculated over frames_to_project to
   * begin with(ie; all stats required were available), hence return
   * the original boost.
   */
  if (num_stats_used_for_gfu_boost >= frames_to_project) return gfu_boost;

  double min_boost_factor = sqrt(p_rc->baseline_gf_interval);
  // Get the current tpl factor (number of frames = frames_to_project).
  double tpl_factor = av1_get_gfu_boost_projection_factor(
      min_boost_factor, MAX_GFUBOOST_FACTOR, frames_to_project);
  // Get the tpl factor when number of frames = num_stats_used_for_prior_boost.
  double tpl_factor_num_stats = av1_get_gfu_boost_projection_factor(
      min_boost_factor, MAX_GFUBOOST_FACTOR, num_stats_used_for_gfu_boost);
  int projected_gfu_boost =
      (int)rint((tpl_factor * gfu_boost) / tpl_factor_num_stats);
  return projected_gfu_boost;
}